

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outqueue.c
# Opt level: O2

lzma_ret lzma_outq_read(lzma_outq *outq,uint8_t *out,size_t *out_pos,size_t out_size,
                       lzma_vli *unpadded_size,lzma_vli *uncompressed_size)

{
  uint uVar1;
  uint uVar2;
  lzma_ret lVar3;
  lzma_outbuf *plVar4;
  
  uVar1 = outq->bufs_used;
  lVar3 = LZMA_OK;
  if (uVar1 != 0) {
    uVar2 = outq->bufs_pos - uVar1;
    if (outq->bufs_pos < uVar1) {
      uVar2 = uVar2 + outq->bufs_allocated;
    }
    if (outq->bufs[uVar2].finished == true) {
      plVar4 = outq->bufs + uVar2;
      lzma_bufcpy(plVar4->buf,&outq->read_pos,plVar4->size,out,out_pos,out_size);
      lVar3 = LZMA_OK;
      if (plVar4->size <= outq->read_pos) {
        *unpadded_size = plVar4->unpadded_size;
        *uncompressed_size = plVar4->uncompressed_size;
        outq->bufs_used = outq->bufs_used - 1;
        outq->read_pos = 0;
        lVar3 = LZMA_STREAM_END;
      }
    }
  }
  return lVar3;
}

Assistant:

extern lzma_ret
lzma_outq_read(lzma_outq *restrict outq, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size,
		lzma_vli *restrict unpadded_size,
		lzma_vli *restrict uncompressed_size)
{
	// There must be at least one buffer from which to read.
	if (outq->bufs_used == 0)
		return LZMA_OK;

	// Get the buffer.
	uint32_t i = outq->bufs_pos - outq->bufs_used;
	if (outq->bufs_pos < outq->bufs_used)
		i += outq->bufs_allocated;

	lzma_outbuf *buf = &outq->bufs[i];

	// If it isn't finished yet, we cannot read from it.
	if (!buf->finished)
		return LZMA_OK;

	// Copy from the buffer to output.
	lzma_bufcpy(buf->buf, &outq->read_pos, buf->size,
			out, out_pos, out_size);

	// Return if we didn't get all the data from the buffer.
	if (outq->read_pos < buf->size)
		return LZMA_OK;

	// The buffer was finished. Tell the caller its size information.
	*unpadded_size = buf->unpadded_size;
	*uncompressed_size = buf->uncompressed_size;

	// Free this buffer for further use.
	--outq->bufs_used;
	outq->read_pos = 0;

	return LZMA_STREAM_END;
}